

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

void __thiscall
ON_SubDHeap::ReturnOversizedElement(ON_SubDHeap *this,size_t capacity,ON__UINT_PTR *a)

{
  tagWSItem *memblock;
  tagWSItem *p;
  ON__UINT_PTR *a_local;
  size_t capacity_local;
  ON_SubDHeap *this_local;
  
  if ((a != (ON__UINT_PTR *)0x0) && (capacity != 0)) {
    memblock = (tagWSItem *)(a + -3);
    if (memblock == this->m_ws) {
      if (a[-2] == 0) {
        this->m_ws = (tagWSItem *)0x0;
      }
      else {
        this->m_ws = (tagWSItem *)a[-2];
        *(undefined8 *)a[-2] = 0;
      }
    }
    else {
      if (a[-2] != 0) {
        *(tagWSItem **)a[-2] = memblock->m_prev;
      }
      memblock->m_prev->m_next = (tagWSItem *)a[-2];
    }
    onfree(memblock);
  }
  return;
}

Assistant:

void ON_SubDHeap::ReturnOversizedElement(
  size_t capacity,
  ON__UINT_PTR* a
  )
{
  if (0 != a && capacity > 0)
  {
    class tagWSItem* p = ((class tagWSItem*)(a - 1)) - 1;
    if (p == m_ws)
    {
      if (nullptr != p->m_next)
      {
        m_ws = p->m_next;
        p->m_next->m_prev = 0;
      }
      else
        m_ws = nullptr;
    }
    else
    {
      if (p->m_next)
        p->m_next->m_prev = p->m_prev;
      p->m_prev->m_next = p->m_next;
    }
    onfree(p);
  }
}